

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

bool slang::ast::canConnectToRefArg
               (ASTContext *context,Expression *expr,bitmask<slang::ast::VariableFlags> argFlags,
               bool allowConstClassHandle,bool disallowDynamicArrays)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Symbol *pSVar4;
  Type *pTVar5;
  uint uVar6;
  
  uVar6 = (uint)allowConstClassHandle;
  do {
    pSVar4 = Expression::getSymbolReference((Expression *)context,false);
    if (pSVar4 == (Symbol *)0x0) {
      return false;
    }
    uVar3 = pSVar4->kind - Variable;
    if (0x18 < uVar3) {
      return false;
    }
    if ((0x1800c0fU >> (uVar3 & 0x1f) & 1) == 0) {
      return false;
    }
    if ((((ulong)expr & 1) == 0) && (((ulong)pSVar4[5].name._M_str & 0x100000000) != 0)) {
      if ((argFlags.m_bits & 1) == 0) {
        return false;
      }
      pTVar5 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
      if (pTVar5->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar5);
      }
      if ((pTVar5->canonical->super_Symbol).kind != ClassType) {
        return false;
      }
    }
    if (((ulong)expr & 0x20) != 0) {
      if ((*(int *)&pSVar4[5].name._M_str == 0) &&
         (((ulong)pSVar4[5].name._M_str & 0x2000000000) == 0)) {
        return false;
      }
      if ((uVar6 & 1) != 0) {
        pTVar5 = DeclaredType::getType((DeclaredType *)(pSVar4 + 1));
        bVar2 = Type::isDynamicallySizedArray(pTVar5);
        if (bVar2) {
          return false;
        }
      }
    }
    iVar1 = *(int *)&((not_null<const_slang::ast::Scope_*> *)
                     &((AssertionInstanceDetails *)context)->symbol)->ptr;
    if (iVar1 == 0x14) {
      context = (ASTContext *)
                (((AssertionInstanceDetails *)context)->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .size_ctrl.ml;
      argFlags.m_bits = 1;
      uVar6 = 0;
    }
    else {
      if ((iVar1 != 0x13) && (iVar1 != 0x12)) {
        return true;
      }
      context = (ASTContext *)
                (((AssertionInstanceDetails *)context)->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_;
      argFlags.m_bits = 0;
      uVar6 = ((uint)expr & 0x20) >> 5;
    }
  } while( true );
}

Assistant:

static bool canConnectToRefArg(const ASTContext& context, const Expression& expr,
                               bitmask<VariableFlags> argFlags, bool allowConstClassHandle = false,
                               bool disallowDynamicArrays = false) {
    auto sym = expr.getSymbolReference(/* allowPacked */ false);
    if (!sym || !VariableSymbol::isKind(sym->kind))
        return false;

    auto& var = sym->as<VariableSymbol>();
    if (!argFlags.has(VariableFlags::Const) && var.flags.has(VariableFlags::Const) &&
        (!allowConstClassHandle || !var.getType().isClass())) {
        return false;
    }

    const bool isRefStatic = argFlags.has(VariableFlags::RefStatic);
    if (isRefStatic) {
        if (var.lifetime == VariableLifetime::Automatic &&
            !var.flags.has(VariableFlags::RefStatic)) {
            return false;
        }

        if (disallowDynamicArrays && var.getType().isDynamicallySizedArray())
            return false;
    }

    // Need to recursively check the left hand side of element selects and member accesses
    // to be sure this is actually an lvalue and not, for example, the result of a
    // function call or something.
    switch (expr.kind) {
        case ExpressionKind::ElementSelect:
            return canConnectToRefArg(context, expr.as<ElementSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::RangeSelect:
            return canConnectToRefArg(context, expr.as<RangeSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::MemberAccess:
            return canConnectToRefArg(context, expr.as<MemberAccessExpression>().value(), argFlags,
                                      true);
        default:
            return true;
    }
}